

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall AbstractContentContext::BStar(AbstractContentContext *this)

{
  EStatusCode EVar1;
  allocator<char> local_31;
  string local_30;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"B*",&local_31);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::BStar()
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteKeyword("B*");
	return GetCurrentStatusCode();
}